

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector.c
# Opt level: O1

void vector_push_back_empty(vector v)

{
  int iVar1;
  
  if (v != (vector)0x0) {
    if (v->size == v->capacity) {
      iVar1 = vector_reserve(v,v->capacity * 2);
      if (iVar1 != 0) {
        log_write_impl_va("metacall",0x120,"vector_push_back_empty",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                          ,LOG_LEVEL_ERROR,"Vector reserve error");
        return;
      }
    }
    v->size = v->size + 1;
  }
  return;
}

Assistant:

void vector_push_back_empty(vector v)
{
	if (v != NULL)
	{
		if (v->size == v->capacity)
		{
			if (vector_reserve(v, v->capacity * VECTOR_CAPACITY_INCREMENT) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Vector reserve error");

				return;
			}
		}

		++v->size;
	}
}